

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::EmitBlockCommon
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,bool *endOnElse)

{
  bool bVar1;
  int iVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  WasmReaderBase *pWVar3;
  FunctionBody *pFVar4;
  PolymorphicEmitInfo PVar5;
  undefined1 local_38 [8];
  PolymorphicEmitInfo info;
  WasmOp op;
  bool canResetUnreachable;
  bool *endOnElse_local;
  BlockInfo *blockInfo_local;
  WasmBytecodeGenerator *this_local;
  
  EnsureStackAvailable(this);
  bVar1 = IsUnreachable(this);
  info.field_1.singleInfo.type._3_1_ = (bVar1 ^ 0xffU) & 1;
  EnterEvalStackScope(this,blockInfo);
  if (endOnElse != (bool *)0x0) {
    *endOnElse = false;
  }
  do {
    pWVar3 = GetReader(this);
    iVar2 = (*pWVar3->_vptr_WasmReaderBase[2])();
    info.field_1.singleInfo.type._0_2_ = (undefined2)iVar2;
    if (info.field_1.singleInfo.type._0_2_ == wbEnd) {
LAB_0161f49d:
      pFVar4 = GetFunctionBody(this);
      if (pFVar4 == (FunctionBody *)0x0) {
        bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmBytecodePhase);
      }
      else {
        pFVar4 = GetFunctionBody(this);
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar4);
        pFVar4 = GetFunctionBody(this);
        functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar4);
        bVar1 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01ec1678,WasmBytecodePhase,sourceContextId,functionId);
      }
      if (bVar1) {
        PrintOpBegin(this,info.field_1.singleInfo.type._0_2_);
      }
      bVar1 = BlockInfo::HasYield(blockInfo);
      if (bVar1) {
        PVar5 = PopStackPolymorphic(this,blockInfo,(char16 *)0x0);
        info._0_8_ = PVar5.field_1;
        local_38._0_4_ = PVar5.count;
        PVar5._4_4_ = 0;
        PVar5.count = local_38._0_4_;
        PVar5.field_1 =
             (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)
             (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
        YieldToBlock(this,blockInfo,PVar5);
        ReleaseLocation(this,(PolymorphicEmitInfo *)local_38);
      }
      ExitEvalStackScope(this,blockInfo);
      if ((info.field_1.singleInfo.type._3_1_ & 1) != 0) {
        SetUnreachableState(this,false);
      }
      return;
    }
    if ((endOnElse != (bool *)0x0) && (info.field_1.singleInfo.type._0_2_ == wbElse)) {
      *endOnElse = true;
      goto LAB_0161f49d;
    }
    EmitExpr(this,info.field_1.singleInfo.type._0_2_);
  } while( true );
}

Assistant:

void WasmBytecodeGenerator::EmitBlockCommon(BlockInfo* blockInfo, bool* endOnElse /*= nullptr*/)
{
    EnsureStackAvailable();
    bool canResetUnreachable = !IsUnreachable();
    WasmOp op;
    EnterEvalStackScope(blockInfo);

    if(endOnElse) *endOnElse = false;
    do {
        op = GetReader()->ReadExpr();
        if (op == wbEnd)
        {
            break;
        }
        if (endOnElse && op == wbElse)
        {
            *endOnElse = true;
            break;
        }
        EmitExpr(op);
    } while (true);
    DebugPrintOp(op);
    if (blockInfo->HasYield())
    {
        PolymorphicEmitInfo info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        ReleaseLocation(&info);
    }
    ExitEvalStackScope(blockInfo);
    if (canResetUnreachable)
    {
        SetUnreachableState(false);
    }
}